

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

int __thiscall xray_re::_lzhuf::DecodeChar(_lzhuf *this)

{
  uint uVar1;
  int iVar2;
  
  for (uVar1 = this->son[0x272]; uVar1 < 0x273; uVar1 = this->son[iVar2 + uVar1]) {
    iVar2 = GetBit(this);
  }
  update(this,uVar1 - 0x273);
  return uVar1 - 0x273;
}

Assistant:

int _lzhuf::DecodeChar(void)
{
	unsigned c;

	c = son[R];

	/* travel from root to leaf, */
	/* choosing the smaller child node (son[]) if the read bit is 0, */
	/* the bigger (son[]+1} if 1 */
	while (c < T) {
		c += GetBit();
		c = son[c];
	}
	c -= T;
	update(c);
	return c;
}